

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall
ipx::Model::DualizeIPMStartingPoint
          (Model *this,Vector *x_user,Vector *xl_user,Vector *xu_user,Vector *slack_user,
          Vector *y_user,Vector *zl_user,Vector *zu_user,Vector *x_solver,Vector *xl_solver,
          Vector *xu_solver,Vector *y_solver,Vector *zl_solver,Vector *zu_solver)

{
  char cVar1;
  Int IVar2;
  Int IVar3;
  double *pdVar4;
  const_reference pvVar5;
  double dVar6;
  Model *in_RDI;
  valarray<double> *in_R8;
  valarray<double> *in_R9;
  valarray<double> *in_stack_00000020;
  valarray<double> *in_stack_00000028;
  valarray<double> *in_stack_00000038;
  valarray<double> *in_stack_00000040;
  Int i;
  Int n;
  Int m;
  valarray<double> *in_stack_ffffffffffffff20;
  double *in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff44;
  int local_3c;
  
  IVar2 = rows(in_RDI);
  IVar3 = cols(in_RDI);
  if ((in_RDI->dualized_ & 1U) == 0) {
    pdVar4 = std::begin<double>(in_stack_ffffffffffffff20);
    std::begin<double>(in_stack_ffffffffffffff20);
    std::copy_n<double_const*,int,double*>
              (pdVar4,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38);
    std::begin<double>(in_stack_ffffffffffffff20);
    std::begin<double>(in_stack_ffffffffffffff20);
    std::copy_n<double_const*,int,double*>
              (pdVar4,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38);
    std::begin<double>(in_stack_ffffffffffffff20);
    std::begin<double>(in_stack_ffffffffffffff20);
    std::copy_n<double_const*,int,double*>
              (pdVar4,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38);
    std::begin<double>(in_stack_ffffffffffffff20);
    std::begin<double>(in_stack_ffffffffffffff20);
    std::copy_n<double_const*,int,double*>
              (pdVar4,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38);
    std::begin<double>(in_stack_ffffffffffffff20);
    std::begin<double>(in_stack_ffffffffffffff20);
    std::copy_n<double_const*,int,double*>
              (pdVar4,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38);
    std::begin<double>(in_stack_ffffffffffffff20);
    std::begin<double>(in_stack_ffffffffffffff20);
    std::copy_n<double_const*,int,double*>
              (pdVar4,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38);
    std::begin<double>(in_stack_ffffffffffffff20);
    std::begin<double>(in_stack_ffffffffffffff20);
    std::copy_n<double_const*,int,double*>
              (pdVar4,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38);
    for (local_3c = 0; local_3c < IVar2; local_3c = local_3c + 1) {
      pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                         (&in_RDI->constr_type_,(long)local_3c);
      cVar1 = *pvVar5;
      if (cVar1 == '<') {
        pdVar4 = std::valarray<double>::operator[](in_R8,(long)local_3c);
        dVar6 = *pdVar4;
        pdVar4 = std::valarray<double>::operator[](in_stack_00000020,(long)(IVar3 + local_3c));
        *pdVar4 = dVar6;
        pdVar4 = std::valarray<double>::operator[](in_stack_00000028,(long)(IVar3 + local_3c));
        *pdVar4 = INFINITY;
        pdVar4 = std::valarray<double>::operator[](in_R9,(long)local_3c);
        dVar6 = -*pdVar4;
        pdVar4 = std::valarray<double>::operator[](in_stack_00000038,(long)(IVar3 + local_3c));
        *pdVar4 = dVar6;
        pdVar4 = std::valarray<double>::operator[](in_stack_00000040,(long)(IVar3 + local_3c));
        *pdVar4 = 0.0;
      }
      else if (cVar1 == '=') {
        pdVar4 = std::valarray<double>::operator[](in_stack_00000020,(long)(IVar3 + local_3c));
        *pdVar4 = 0.0;
        pdVar4 = std::valarray<double>::operator[](in_stack_00000028,(long)(IVar3 + local_3c));
        *pdVar4 = 0.0;
        pdVar4 = std::valarray<double>::operator[](in_stack_00000038,(long)(IVar3 + local_3c));
        *pdVar4 = 0.0;
        pdVar4 = std::valarray<double>::operator[](in_stack_00000040,(long)(IVar3 + local_3c));
        *pdVar4 = 0.0;
      }
      else if (cVar1 == '>') {
        pdVar4 = std::valarray<double>::operator[](in_stack_00000020,(long)(IVar3 + local_3c));
        *pdVar4 = INFINITY;
        pdVar4 = std::valarray<double>::operator[](in_R8,(long)local_3c);
        dVar6 = -*pdVar4;
        pdVar4 = std::valarray<double>::operator[](in_stack_00000028,(long)(IVar3 + local_3c));
        *pdVar4 = dVar6;
        pdVar4 = std::valarray<double>::operator[](in_stack_00000038,(long)(IVar3 + local_3c));
        *pdVar4 = 0.0;
        pdVar4 = std::valarray<double>::operator[](in_R9,(long)local_3c);
        dVar6 = *pdVar4;
        pdVar4 = std::valarray<double>::operator[](in_stack_00000040,(long)(IVar3 + local_3c));
        *pdVar4 = dVar6;
      }
    }
  }
  return;
}

Assistant:

void Model::DualizeIPMStartingPoint(const Vector& x_user,
                                    const Vector& xl_user,
                                    const Vector& xu_user,
                                    const Vector& slack_user,
                                    const Vector& y_user,
                                    const Vector& zl_user,
                                    const Vector& zu_user,
                                    Vector& x_solver,
                                    Vector& xl_solver,
                                    Vector& xu_solver,
                                    Vector& y_solver,
                                    Vector& zl_solver,
                                    Vector& zu_solver) const {
    const Int m = rows();
    const Int n = cols();

    if (dualized_) {
        // Not implemented.
        assert(false);
    }
    else {
        assert(num_constr_ == m);
        assert(num_var_ == n);

        std::copy_n(std::begin(x_user), num_var_, std::begin(x_solver));
        std::copy_n(std::begin(slack_user), num_constr_,
                    std::begin(x_solver) + n);
        std::copy_n(std::begin(xl_user), num_var_, std::begin(xl_solver));
        std::copy_n(std::begin(xu_user), num_var_, std::begin(xu_solver));
        std::copy_n(std::begin(y_user), num_constr_, std::begin(y_solver));
        std::copy_n(std::begin(zl_user), num_var_, std::begin(zl_solver));
        std::copy_n(std::begin(zu_user), num_var_, std::begin(zu_solver));

        for (Int i = 0; i < m; i++) {
            switch (constr_type_[i]) {
            case '=':
                assert(lb_[n+i] == 0.0 && ub_[n+i] == 0.0);
                // For a fixed slack variable xl, xu, zl and zu won't be used
                // by the IPM. Just put them to zero.
                xl_solver[n+i] = 0.0;
                xu_solver[n+i] = 0.0;
                zl_solver[n+i] = 0.0;
                zu_solver[n+i] = 0.0;
                break;
            case '<':
                assert(lb_[n+i] == 0.0 && ub_[n+i] == INFINITY);
                xl_solver[n+i] = slack_user[i];
                xu_solver[n+i] = INFINITY;
                zl_solver[n+i] = -y_user[i];
                zu_solver[n+i] = 0.0;
                break;
            case '>':
                assert(lb_[n+i] == -INFINITY && ub_[n+i] == 0.0);
                xl_solver[n+i] = INFINITY;
                xu_solver[n+i] = -slack_user[i];
                zl_solver[n+i] = 0.0;
                zu_solver[n+i] = y_user[i];
                break;
            }
        }
    }
}